

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu_info.cpp
# Opt level: O2

uint32_t __thiscall license::os::CpuInfo::model(CpuInfo *this)

{
  int *piVar1;
  uint *puVar2;
  uint uVar3;
  uint uVar4;
  
  uVar3 = 0;
  piVar1 = (int *)cpuid_basic_info(0);
  uVar4 = 0;
  if (*piVar1 != 0) {
    puVar2 = (uint *)cpuid_Version_info(1);
    uVar3 = *puVar2;
    uVar4 = puVar2[1] << 0x18;
  }
  return uVar3 >> 2 & 0xffe000 | uVar3 & 0x3fff | uVar4;
}

Assistant:

uint32_t CpuInfo::model() const {
	uint32_t level = 1, eax = 0, ebx = 0, ecx = 0, edx = 0;
	__get_cpuid(level, &eax, &ebx, &ecx, &edx);
	// ax bits 0-3 stepping,4-7 model,8-11 family id,12-13 processor type
	//        14-15 reserved, 16-19 extended model, 20-27 extended family, 27-31 reserved
	// bx bits 0-7 brand index
	return (eax & 0x3FFF) | (eax & 0x3FF8000) >> 2 | (ebx & 0xff) << 24;
}